

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerConnection.cxx
# Opt level: O2

string * __thiscall
cmServerBufferStrategy::BufferMessage
          (string *__return_storage_ptr__,cmServerBufferStrategy *this,string *RawReadBuffer)

{
  pointer pcVar1;
  __type _Var2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  string line;
  
  do {
    lVar3 = std::__cxx11::string::find((char)RawReadBuffer,10);
    if (lVar3 == -1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&line);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::substr((ulong)&line,(ulong)RawReadBuffer);
    if (1 < line._M_string_length) {
      uVar5 = line._M_string_length - 1;
      pcVar4 = (char *)std::__cxx11::string::at((ulong)&line);
      if (*pcVar4 == '\r') {
        std::__cxx11::string::erase((ulong)&line,uVar5);
      }
    }
    pcVar1 = (RawReadBuffer->_M_dataplus)._M_p;
    std::__cxx11::string::erase(RawReadBuffer,pcVar1,pcVar1 + lVar3 + 1);
    _Var2 = std::operator==(&line,&kSTART_MAGIC_abi_cxx11_);
    if (_Var2) {
      (this->RequestBuffer)._M_string_length = 0;
      *(this->RequestBuffer)._M_dataplus._M_p = '\0';
    }
    else {
      _Var2 = std::operator==(&line,&kEND_MAGIC_abi_cxx11_);
      if (_Var2) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::string::swap((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&line);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::append((string *)&this->RequestBuffer);
      std::__cxx11::string::append((char *)&this->RequestBuffer);
    }
    std::__cxx11::string::~string((string *)&line);
  } while( true );
}

Assistant:

std::string cmServerBufferStrategy::BufferMessage(std::string& RawReadBuffer)
{
  for (;;) {
    auto needle = RawReadBuffer.find('\n');

    if (needle == std::string::npos) {
      return "";
    }
    std::string line = RawReadBuffer.substr(0, needle);
    const auto ls = line.size();
    if (ls > 1 && line.at(ls - 1) == '\r') {
      line.erase(ls - 1, 1);
    }
    RawReadBuffer.erase(RawReadBuffer.begin(),
                        RawReadBuffer.begin() + static_cast<long>(needle) + 1);
    if (line == kSTART_MAGIC) {
      RequestBuffer.clear();
      continue;
    }
    if (line == kEND_MAGIC) {
      std::string rtn;
      rtn.swap(this->RequestBuffer);
      return rtn;
    }

    this->RequestBuffer += line;
    this->RequestBuffer += "\n";
  }
}